

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O0

MPP_RET realloc_buffer(RK_U8 **buf,RK_U32 *max_size,RK_U32 add_size)

{
  uint uVar1;
  RK_U8 *pRVar2;
  undefined8 in_R9;
  undefined4 uVar3;
  MPP_RET ret;
  RK_U32 add_size_local;
  RK_U32 *max_size_local;
  RK_U8 **buf_local;
  
  uVar3 = 0xfffffffe;
  if (*buf == (RK_U8 *)0x0) {
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_parse","[realloc_buffer] pointer is null, %p \n",(char *)0x0,*buf,in_R9,
                 0xfffffffe);
    }
  }
  else {
    uVar1 = add_size + 0xf & 0xfffffff0;
    pRVar2 = (RK_U8 *)mpp_osal_realloc("realloc_buffer",*buf,(ulong)(*max_size + uVar1));
    *buf = pRVar2;
    if (*buf != (RK_U8 *)0x0) {
      *max_size = uVar1 + *max_size;
      return MPP_OK;
    }
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_parse","[realloc_buffer] ERROR: max_size=%d, add_size=%d \n",(char *)0x0,
                 (ulong)*max_size,(ulong)uVar1,uVar3);
    }
  }
  return MPP_ERR_MALLOC;
}

Assistant:

static MPP_RET realloc_buffer(RK_U8 **buf, RK_U32 *max_size, RK_U32 add_size)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    if ((*buf) == NULL) {
        H264D_ERR("[realloc_buffer] pointer is null, %p \n", (*buf));
        ret = MPP_ERR_MALLOC;
        goto __FAILED;
    }

    add_size = MPP_ALIGN(add_size, 16);

    (*buf) = mpp_realloc((*buf), RK_U8, ((*max_size) + add_size));
    if ((*buf) == NULL) {
        H264D_ERR("[realloc_buffer] ERROR: max_size=%d, add_size=%d \n", (*max_size), add_size);
        ret = MPP_ERR_MALLOC;
        goto __FAILED;
    }
    (*max_size) += add_size;

    return ret = MPP_OK;
__FAILED:
    return ret;
}